

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,NormalFuncCall *n_func_call,void *data)

{
  pointer pSVar1;
  long in_RDX;
  undefined8 in_RDI;
  ExpVarData exp_var_data;
  ExpVarData local_24;
  long local_18;
  
  local_18 = in_RDX;
  ExpVarData::ExpVarData(&local_24,SemanticOp_Read);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x19388a);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,&local_24);
  pSVar1 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1938ab);
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,in_RDI,&local_24);
  if (local_18 != 0) {
    *(undefined1 *)(local_18 + 8) = 1;
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(NormalFuncCall *n_func_call, void *data)
    {
        // Function call must be read semantic
        ExpVarData exp_var_data{ SemanticOp_Read };
        n_func_call->caller_->Accept(this, &exp_var_data);
        n_func_call->args_->Accept(this, &exp_var_data);

        if (data)
            static_cast<ExpVarData *>(data)->results_any_count_ = true;
    }